

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O2

int satoko_add_variable(solver_t *s,char sign)

{
  uint entry;
  vec_act_t *pvVar1;
  uint uVar2;
  sdbl_t *psVar3;
  uint uVar4;
  
  entry = s->activity->size;
  vec_wl_push(s->watches);
  vec_wl_push(s->watches);
  pvVar1 = s->activity;
  uVar2 = pvVar1->size;
  if (uVar2 == pvVar1->cap) {
    uVar4 = 0x10;
    if (0xf < uVar2) {
      uVar4 = uVar2 * 2;
    }
    if (uVar2 < uVar4) {
      psVar3 = (sdbl_t *)realloc(pvVar1->data,(ulong)uVar4 << 3);
      pvVar1->data = psVar3;
      if (psVar3 == (sdbl_t *)0x0) {
        __assert_fail("p->data != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_sdbl.h"
                      ,0x6e,"void vec_sdbl_reserve(vec_sdbl_t *, unsigned int)");
      }
      pvVar1->cap = uVar4;
      uVar2 = pvVar1->size;
    }
  }
  pvVar1->data[uVar2] = 0;
  pvVar1->size = uVar2 + 1;
  vec_uint_push_back(s->levels,0);
  vec_char_push_back(s->assigns,'\x03');
  vec_char_push_back(s->polarity,sign);
  vec_uint_push_back(s->reasons,0xffffffff);
  vec_uint_push_back(s->stamps,0);
  vec_char_push_back(s->seen,'\0');
  heap_insert(s->var_order,entry);
  if (s->marks != (vec_char_t *)0x0) {
    vec_char_push_back(s->marks,'\0');
  }
  return entry;
}

Assistant:

int satoko_add_variable(solver_t *s, char sign)
{
    unsigned var = vec_act_size(s->activity);
    vec_wl_push(s->watches);
    vec_wl_push(s->watches);
    vec_act_push_back(s->activity, 0);
    vec_uint_push_back(s->levels, 0);
    vec_char_push_back(s->assigns, SATOKO_VAR_UNASSING);
    vec_char_push_back(s->polarity, sign);
    vec_uint_push_back(s->reasons, UNDEF);
    vec_uint_push_back(s->stamps, 0);
    vec_char_push_back(s->seen, 0);
    heap_insert(s->var_order, var);
    if (s->marks)
        vec_char_push_back(s->marks, 0);
    return var;
}